

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F3DAudio.c
# Opt level: O0

uint32_t F3DAudioCheckInitParams(uint32_t SpeakerChannelMask,float SpeedOfSound,uint8_t *instance)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  long in_RSI;
  int in_EDI;
  float in_XMM0_Da;
  SDL_AssertState sdl_assert_state_2;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  uint32_t i;
  uint8_t speakerMaskIsValid;
  uint32_t kAllowedSpeakerMasks [10];
  uint local_40;
  int local_38 [10];
  long local_10;
  float local_8;
  int local_4;
  
  local_10 = in_RSI;
  local_8 = in_XMM0_Da;
  local_4 = in_EDI;
  memcpy(local_38,&DAT_00146060,0x28);
  bVar2 = false;
  do {
    if (local_10 != 0) goto LAB_0010af6a;
    iVar3 = SDL_ReportAssertion(&F3DAudioCheckInitParams::sdl_assert_data,"F3DAudioCheckInitParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x71);
  } while (iVar3 == 0);
  if (iVar3 == 1) {
    pcVar1 = (code *)swi(3);
    uVar4 = (*pcVar1)();
    return uVar4;
  }
LAB_0010af6a:
  for (local_40 = 0; local_40 < 10; local_40 = local_40 + 1) {
    if (local_4 == local_38[local_40]) {
      bVar2 = true;
      break;
    }
  }
  do {
    if (bVar2) goto LAB_0010b008;
    iVar3 = SDL_ReportAssertion(&F3DAudioCheckInitParams::sdl_assert_data_1,
                                "F3DAudioCheckInitParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x85);
  } while (iVar3 == 0);
  if (iVar3 == 1) {
    pcVar1 = (code *)swi(3);
    uVar4 = (*pcVar1)();
    return uVar4;
  }
LAB_0010b008:
  do {
    if (1.1754944e-38 <= local_8) {
      return 1;
    }
    iVar3 = SDL_ReportAssertion(&F3DAudioCheckInitParams::sdl_assert_data_2,
                                "F3DAudioCheckInitParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x87);
  } while (iVar3 == 0);
  if (iVar3 != 1) {
    return 1;
  }
  pcVar1 = (code *)swi(3);
  uVar4 = (*pcVar1)();
  return uVar4;
}

Assistant:

F3DAUDIOAPI uint32_t F3DAudioCheckInitParams(
	uint32_t SpeakerChannelMask,
	float SpeedOfSound,
	F3DAUDIO_HANDLE instance
) {
	const uint32_t kAllowedSpeakerMasks[] =
	{
		SPEAKER_MONO,
		SPEAKER_STEREO,
		SPEAKER_2POINT1,
		SPEAKER_QUAD,
		SPEAKER_SURROUND,
		SPEAKER_4POINT1,
		SPEAKER_5POINT1,
		SPEAKER_5POINT1_SURROUND,
		SPEAKER_7POINT1,
		SPEAKER_7POINT1_SURROUND,
	};
	uint8_t speakerMaskIsValid = 0;
	uint32_t i;

	POINTER_CHECK(instance);

	for (i = 0; i < ARRAY_COUNT(kAllowedSpeakerMasks); i += 1)
	{
		if (SpeakerChannelMask == kAllowedSpeakerMasks[i])
		{
			speakerMaskIsValid = 1;
			break;
		}
	}

	/* The docs don't clearly say it, but the debug dll does check that
	 * we're exactly in one of the allowed speaker configurations.
	 * -Adrien
	 */
	PARAM_CHECK(
		speakerMaskIsValid == 1,
		"SpeakerChannelMask is invalid. Needs to be one of"
		" MONO, STEREO, QUAD, 2POINT1, 4POINT1, 5POINT1, 7POINT1,"
		" SURROUND, 5POINT1_SURROUND, or 7POINT1_SURROUND."
	);

	PARAM_CHECK(SpeedOfSound >= FLT_MIN, "SpeedOfSound needs to be >= FLT_MIN");

	return PARAM_CHECK_OK;
}